

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

void tagsEmptyHash(TidyDocImpl *doc,TidyTagImpl *tags)

{
  _DictHash *p_Var1;
  DictHash *local_30;
  DictHash *next;
  DictHash *prev;
  uint i;
  TidyTagImpl *tags_local;
  TidyDocImpl *doc_local;
  
  for (prev._4_4_ = 0; prev._4_4_ < 0xb2; prev._4_4_ = prev._4_4_ + 1) {
    local_30 = tags->hashtab[prev._4_4_];
    while (local_30 != (DictHash *)0x0) {
      p_Var1 = local_30->next;
      (*doc->allocator->vtbl->free)(doc->allocator,local_30);
      local_30 = p_Var1;
    }
    tags->hashtab[prev._4_4_] = (DictHash *)0x0;
  }
  return;
}

Assistant:

static void tagsEmptyHash( TidyDocImpl* doc, TidyTagImpl* tags )
{
    uint i;
    DictHash *prev, *next;

    for (i = 0; i < ELEMENT_HASH_SIZE; ++i)
    {
        prev = NULL;
        next = tags->hashtab[i];

        while(next)
        {
            prev = next->next;
            TidyDocFree(doc, next);
            next = prev;
        }

        tags->hashtab[i] = NULL;
    }
}